

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

uint ON_RowReduce(uint row_count,uint col_count,double zero_pivot_tolerance,double **constA,
                 bool bInitializeB,bool bInitializeColumnPermutation,double **A,double **B,
                 uint *column_permutation,double *pivots)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  ON_Matrix *this;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  double dVar22;
  int iVar24;
  double dVar23;
  long lVar21;
  
  if (pivots == (double *)0x0) {
    pdVar14 = (double *)0x10;
  }
  else {
    *pivots = -1.0;
    pivots[1] = -1.0;
    pdVar14 = pivots + 2;
    pivots[2] = 0.0;
  }
  uVar8 = 0xffffffff;
  if (B != (double **)0x0 && (1 < col_count + 1 && 1 < row_count + 1)) {
    uVar6 = (ulong)row_count;
    if (bInitializeB) {
      uVar17 = 0;
      do {
        pdVar9 = B[uVar17];
        memset(pdVar9,0,uVar6 * 8);
        pdVar9[uVar17] = 1.0;
        uVar17 = uVar17 + 1;
      } while (uVar6 != uVar17);
    }
    auVar7 = _DAT_0069b120;
    if (bInitializeColumnPermutation && column_permutation != (uint *)0x0) {
      lVar21 = uVar6 - 1;
      auVar18._8_4_ = (int)lVar21;
      auVar18._0_8_ = lVar21;
      auVar18._12_4_ = (int)((ulong)lVar21 >> 0x20);
      uVar17 = 0;
      auVar18 = auVar18 ^ _DAT_0069b120;
      auVar20 = _DAT_0069b170;
      do {
        bVar5 = auVar18._0_4_ < SUB164(auVar20 ^ auVar7,0);
        iVar19 = auVar18._4_4_;
        iVar24 = SUB164(auVar20 ^ auVar7,4);
        if ((bool)(~(iVar19 < iVar24 || iVar24 == iVar19 && bVar5) & 1)) {
          column_permutation[uVar17] = (uint)uVar17;
        }
        if (iVar19 >= iVar24 && (iVar24 != iVar19 || !bVar5)) {
          column_permutation[uVar17 + 1] = (uint)uVar17 + 1;
        }
        uVar17 = uVar17 + 2;
        lVar21 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 2;
        auVar20._8_8_ = lVar21 + 2;
      } while ((uVar6 + 1 & 0xfffffffffffffffe) != uVar17);
    }
    if (A == (double **)0x0) {
      if (constA == (double **)0x0) {
        return 0xffffffff;
      }
      this = (ON_Matrix *)operator_new(0x48);
      ON_Matrix::ON_Matrix(this,row_count,col_count);
      A = this->m;
    }
    else {
      this = (ON_Matrix *)0x0;
    }
    if (A != (double **)0x0 && constA != (double **)0x0) {
      uVar17 = 0;
      do {
        pdVar9 = constA[uVar17];
        pdVar2 = A[uVar17];
        uVar11 = 0;
        do {
          pdVar2[uVar11] = pdVar9[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar6);
    }
    uVar8 = col_count;
    if (row_count < col_count) {
      uVar8 = row_count;
    }
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      uVar11 = 1;
      uVar17 = 0;
      do {
        uVar13 = uVar17 & 0xffffffff;
        dVar22 = -1.0;
        uVar12 = uVar17;
        uVar15 = uVar17;
        do {
          uVar10 = uVar17;
          dVar23 = dVar22;
          do {
            dVar22 = ABS(A[uVar15][uVar10]);
            uVar16 = uVar12;
            if (dVar23 < dVar22) {
              uVar13 = uVar15 & 0xffffffff;
              uVar16 = uVar10;
            }
            uVar12 = uVar16 & 0xffffffff;
            if (dVar22 <= dVar23) {
              dVar22 = dVar23;
            }
            uVar10 = uVar10 + 1;
            dVar23 = dVar22;
          } while (uVar10 < col_count);
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar6);
        if (dVar22 < 0.0) {
          uVar17 = 0xffffffff;
          goto LAB_004f4242;
        }
        if ((pivots != (double *)0x0) && (*pivots <= 0.0 && *pivots != 0.0)) {
          pivots[1] = dVar22;
          *pivots = dVar22;
        }
        if (dVar22 <= (double)(-(ulong)(0.0 <= zero_pivot_tolerance) & (ulong)zero_pivot_tolerance))
        {
          if (pivots != (double *)0x0) {
            *pdVar14 = dVar22;
          }
          goto LAB_004f4242;
        }
        if ((pivots != (double *)0x0) &&
           ((pdVar9 = pivots, *pivots <= dVar22 && dVar22 != *pivots ||
            (pdVar9 = pivots + 1, dVar22 < pivots[1])))) {
          *pdVar9 = dVar22;
        }
        pdVar9 = A[uVar13];
        pdVar2 = B[uVar13];
        if (uVar17 < uVar13) {
          A[uVar13] = A[uVar17];
          A[uVar17] = pdVar9;
          B[uVar13] = B[uVar17];
          B[uVar17] = pdVar2;
          if (column_permutation != (uint *)0x0) {
            uVar1 = column_permutation[uVar13];
            column_permutation[uVar13] = column_permutation[uVar17];
            column_permutation[uVar17] = uVar1;
          }
        }
        uVar16 = uVar16 & 0xffffffff;
        dVar22 = pdVar9[uVar16];
        pdVar9[uVar16] = pdVar9[uVar17];
        uVar13 = uVar17 + 1;
        if (uVar13 < uVar6) {
          uVar12 = uVar11;
          do {
            pdVar3 = A[uVar12];
            dVar23 = pdVar3[uVar16] / -dVar22;
            pdVar3[uVar16] = pdVar3[uVar17];
            if ((dVar23 != 0.0) || (NAN(dVar23))) {
              pdVar4 = B[uVar12];
              uVar15 = 0;
              do {
                pdVar4[uVar15] = pdVar2[uVar15] * dVar23 + pdVar4[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar11 != uVar15);
              if ((uint)uVar11 < col_count) {
                do {
                  pdVar4[uVar15] = pdVar2[uVar15] * dVar23 + pdVar4[uVar15];
                  pdVar3[uVar15] = pdVar9[uVar15] * dVar23 + pdVar3[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar15 < col_count);
              }
            }
            uVar12 = uVar12 + 1;
          } while ((uint)uVar12 != row_count);
        }
        uVar11 = uVar11 + 1;
        uVar17 = uVar13;
      } while (uVar13 != uVar8);
      uVar17 = (ulong)uVar8;
LAB_004f4242:
      uVar8 = (uint)uVar17;
    }
    if (this != (ON_Matrix *)0x0) {
      (*this->_vptr_ON_Matrix[1])();
    }
  }
  return uVar8;
}

Assistant:

unsigned int ON_RowReduce(
  unsigned int row_count,
  unsigned int col_count,
  double zero_pivot_tolerance,
  const double*const* constA,
  bool bInitializeB,
  bool bInitializeColumnPermutation,
  double** A,
  double** B,
  unsigned int* column_permutation,
  double pivots[3]
  )
{
  double pivots_buffer[3];
  if (nullptr == pivots)
    pivots = pivots_buffer;
  pivots[0] = pivots[1] = -1.0;
  pivots[2] = 0.0;

  if (row_count < 1 || ON_UNSET_UINT_INDEX == row_count)
    return ON_UNSET_UINT_INDEX;

  if (col_count < 1 || ON_UNSET_UINT_INDEX == col_count)
    return ON_UNSET_UINT_INDEX;

  if (nullptr == B)
    return ON_UNSET_UINT_INDEX;

  unsigned int i, j;
  double* a;
  double* b;

  if (bInitializeB)
  {
    for (i = 0; i < row_count; i++)
    {
      b = B[i];
      for (j = 0; j < row_count; j++)
        b[j] = 0.0;
      b[i] = 1.0;
    }
  }

  if (bInitializeColumnPermutation && nullptr != column_permutation)
  {
    for (j = 0; j < row_count; j++)
      column_permutation[j] = j;
  }

  if (!(zero_pivot_tolerance >= 0.0))
    zero_pivot_tolerance = 0.0;

  std::unique_ptr< ON_Matrix > uA;
  if (nullptr == A)
  {
    if (nullptr == constA)
      return ON_UNSET_UINT_INDEX;
    uA = std::unique_ptr< ON_Matrix >(new ON_Matrix(row_count, col_count));
    A = uA.get()->m;
  }

  if (nullptr != constA && nullptr != A)
  {
    for (i = 0; i < row_count; i++)
    {
      const double* c = constA[i];
      a = A[i];
      for (j = 0; j < row_count; j++)
        a[j] = c[j];
    }
  }

  double* r;
  double* s;
  double x, xx;
  unsigned int ii, jj;
  ii = jj = 0;
  xx = fabs(A[ii][jj]);
  unsigned int rank;
  for (rank = 0; rank < row_count; rank++)
  {
    if (rank >= col_count)
      return rank;

    xx = -1.0;
    ii = jj = rank;
    for (i = rank; i < row_count; i++)
    {
      r = A[i];
      for (j = rank; j < col_count; j++)
      {
        x = fabs(r[j]);
        if (x > xx)
        {
          ii = i;
          jj = j;
          xx = x;
        }
      }
    }

    if (!(xx >= 0.0))
      return ON_UNSET_UINT_INDEX;

    if (pivots[0] < 0.0)
      pivots[0] = pivots[1] = xx;

    if (xx <= zero_pivot_tolerance)
    {
      pivots[2] = xx;
      return rank;
    }

    if (xx > pivots[0])
      pivots[0] = xx;
    else if (xx < pivots[1])
      pivots[1] = xx;


    a = A[ii];
    b = B[ii];
    if (ii > rank)
    {
      // swap rows M[ii] and M[rank] so maximum coefficient is in M[rank][jj]
      A[ii] = A[rank];
      A[rank] = a;
      B[ii] = B[rank];
      B[rank] = b;
      if (nullptr != column_permutation)
      {
        j = column_permutation[ii];
        column_permutation[ii] = column_permutation[rank];
        column_permutation[rank] = j;
      }
    }

    // swap columns M[jj] and M[rank] to maximum coefficient is in M[rank][rank]
    xx = -a[jj];
    a[jj] = a[rank];
    //a[rank] = -xx; // DEBUG

    for (i = rank + 1; i < row_count; i++)
    {
      // swap columns M[jj] and M[rank] 
      r = A[i];
      x = r[jj] / xx;
      //double dd = r[jj]; // DEBUG
      r[jj] = r[rank];
      //r[rank] = dd; // DEBUG

      // Use row operation
      // M[i] = M[i] - (row[i]/M[rank][rank])*M[rank]
      // to M[i][rank]
      if (0.0 != x)
      {
        s = B[i];
        for (j = 0; j <= rank; j++)
        {
          s[j] += x*b[j];
          //r[j] += x*a[j]; // DEBUG
        }
        for (/*empty init*/; j < col_count; j++)
        {
          s[j] += x*b[j];
          r[j] += x*a[j];
        }
      }
    }
  }
  return rank;
}